

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O3

void __thiscall QFont::QFont(QFont *this,QString *family,int pointSize,int weight,bool italic)

{
  QArrayData *pQVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  CutResult CVar4;
  QFontPrivate *pQVar5;
  qsizetype qVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long in_FS_OFFSET;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  QStringView QVar15;
  undefined1 auVar16 [16];
  QStringList familyList;
  double local_b0;
  QArrayDataPointer<QString> local_98;
  QString local_78;
  long local_60;
  QArrayDataPointer<QString> local_58;
  long local_38;
  long originalLength;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = (QFontPrivate *)operator_new(0x98);
  QFontPrivate::QFontPrivate(pQVar5);
  (this->d).d.ptr = pQVar5;
  LOCK();
  (pQVar5->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar5->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int> + 1);
  UNLOCK();
  this->resolve_mask = 0x20000;
  if (pointSize < 1) {
    local_b0 = 12.0;
    uVar3 = 0x20000;
  }
  else {
    this->resolve_mask = 0x20002;
    local_b0 = (double)pointSize;
    uVar3 = 0x20002;
  }
  if (weight < 0) {
    uVar9 = 0x1900000000000;
  }
  else {
    uVar3 = uVar3 | 0x30;
    this->resolve_mask = uVar3;
    uVar9 = (ulong)(weight & 0x3ff) << 0x28;
  }
  if (italic) {
    this->resolve_mask = uVar3 | 0x20;
    uVar7 = 0x10000000;
  }
  else {
    uVar7 = 0;
  }
  pQVar1 = (QArrayData *)(family->d).size;
  local_98.d = (Data *)0x0;
  local_98.ptr = (QString *)0x0;
  local_98.size = 0;
  if (pQVar1 == (QArrayData *)0x0) {
    qVar6 = 0;
    uVar11 = 0;
    uVar12 = 0;
    uVar13 = 0;
    uVar14 = 0;
  }
  else {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.d = (Data *)pQVar1;
    local_78.d.ptr = (family->d).ptr;
    QStringView::split(&local_58,&local_78,0x2c,0,1);
    uVar3 = (uint)local_58.size;
    QList<QString>::reserve((QList<QString> *)&local_98,(long)(int)uVar3);
    if (0 < (int)uVar3) {
      uVar8 = (ulong)(uVar3 & 0x7fffffff);
      lVar10 = 8;
      do {
        QVar15.m_data = *(storage_type_conflict **)((long)&((local_58.ptr)->d).d + lVar10);
        QVar15.m_size = *(qsizetype *)((long)local_58.ptr + lVar10 + -8);
        auVar16 = QtPrivate::trimmed(QVar15);
        auVar16._8_8_ = auVar16._8_8_;
        originalLength = auVar16._0_8_;
        if (originalLength == 0) {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = auVar16._8_8_;
          auVar16 = auVar2 << 0x40;
        }
        else if (*auVar16._8_8_ == 0x27) {
          if (auVar16._8_8_[originalLength + -1] == 0x27) goto LAB_0048174c;
        }
        else if ((*auVar16._8_8_ == 0x22) && (auVar16._8_8_[originalLength + -1] == 0x22)) {
LAB_0048174c:
          local_60 = originalLength + -2;
          local_78.d.d = (Data *)0x1;
          CVar4 = QtPrivate::QContainerImplHelper::mid
                            (originalLength,(qsizetype *)&local_78,&local_60);
          if (CVar4 == Null) {
            auVar16 = ZEXT816(0);
          }
          else {
            auVar16._8_8_ = auVar16._8_8_ + (long)local_78.d.d;
            auVar16._0_8_ = local_60;
          }
        }
        QString::QString(&local_78,auVar16._8_8_,auVar16._0_8_);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_98,local_98.size,&local_78);
        QList<QString>::end((QList<QString> *)&local_98);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        lVar10 = lVar10 + 0x10;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d)->super_QArrayData,0x10,0x10);
      }
    }
    qVar6 = local_98.size;
    uVar11 = local_98.d._0_4_;
    uVar12 = local_98.d._4_4_;
    uVar13 = local_98.ptr._0_4_;
    uVar14 = local_98.ptr._4_4_;
  }
  pQVar5 = (this->d).d.ptr;
  local_98.d = (Data *)0x0;
  local_98.ptr = (QString *)0x0;
  local_98.size = 0;
  local_58.d = (pQVar5->request).families.d.d;
  local_58.ptr = (pQVar5->request).families.d.ptr;
  *(undefined4 *)&(pQVar5->request).families.d.d = uVar11;
  *(undefined4 *)((long)&(pQVar5->request).families.d.d + 4) = uVar12;
  *(undefined4 *)&(pQVar5->request).families.d.ptr = uVar13;
  *(undefined4 *)((long)&(pQVar5->request).families.d.ptr + 4) = uVar14;
  local_58.size = (pQVar5->request).families.d.size;
  (pQVar5->request).families.d.size = qVar6;
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
  pQVar5 = (this->d).d.ptr;
  (pQVar5->request).pointSize = local_b0;
  (pQVar5->request).pixelSize = -1.0;
  *(ulong *)&(pQVar5->request).field_0x60 =
       *(ulong *)&(pQVar5->request).field_0x60 & 0xfffc00ffffffffff | uVar9;
  pQVar5 = (this->d).d.ptr;
  *(ulong *)&(pQVar5->request).field_0x60 =
       *(ulong *)&(pQVar5->request).field_0x60 & 0xffffffffcfffffff | uVar7;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QFont::QFont(const QString &family, int pointSize, int weight, bool italic)
    : d(new QFontPrivate()), resolve_mask(QFont::FamiliesResolved)
{
    if (pointSize <= 0) {
        pointSize = 12;
    } else {
        resolve_mask |= QFont::SizeResolved;
    }

    if (weight < 0) {
        weight = Normal;
    } else {
        resolve_mask |= QFont::WeightResolved | QFont::StyleResolved;
    }

    if (italic)
        resolve_mask |= QFont::StyleResolved;

    d->request.families = splitIntoFamilies(family);
    d->request.pointSize = qreal(pointSize);
    d->request.pixelSize = -1;
    d->request.weight = weight;
    d->request.style = italic ? QFont::StyleItalic : QFont::StyleNormal;
}